

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<IR::Instr_*,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Allocate(BaseDictionary<IR::Instr_*,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int **ppBuckets,EntryType **ppEntries,uint bucketCount,int size)

{
  code *pcVar1;
  bool bVar2;
  int *__s;
  undefined4 *puVar3;
  EntryType *pEVar4;
  
  __s = AllocateBuckets(this,bucketCount);
  if (__s == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x46b,"(buckets)","buckets");
    if (!bVar2) goto LAB_0040f39c;
    *puVar3 = 0;
  }
  pEVar4 = AllocateEntries(this,size,true);
  if (pEVar4 == (EntryType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x471,"(entries)","entries");
    if (!bVar2) {
LAB_0040f39c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  memset(__s,0xff,(ulong)bucketCount << 2);
  *ppBuckets = __s;
  *ppEntries = pEVar4;
  return;
}

Assistant:

void Allocate(__deref_out_ecount(bucketCount) int** ppBuckets, __deref_out_ecount(size) EntryType** ppEntries, DECLSPEC_GUARD_OVERFLOW uint bucketCount, DECLSPEC_GUARD_OVERFLOW int size)
        {
            int *const buckets = AllocateBuckets(bucketCount);
            Assert(buckets); // no-throw allocators are currently not supported

            EntryType *entries;
            try
            {
                entries = AllocateEntries(size);
                Assert(entries); // no-throw allocators are currently not supported
            }
            catch(...)
            {
                DeleteBuckets(buckets, bucketCount);
                throw;
            }

            memset(buckets, -1, bucketCount * sizeof(buckets[0]));

            *ppBuckets = buckets;
            *ppEntries = entries;
        }